

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

void recall_tree_ns::finish(recall_tree *b)

{
  v_array<recall_tree_ns::node> *pvVar1;
  long in_RDI;
  size_t i;
  v_array<recall_tree_ns::node> *pvVar2;
  v_array<recall_tree_ns::node> *this;
  
  pvVar2 = (v_array<recall_tree_ns::node> *)0x0;
  while( true ) {
    this = pvVar2;
    pvVar1 = (v_array<recall_tree_ns::node> *)
             v_array<recall_tree_ns::node>::size((v_array<recall_tree_ns::node> *)(in_RDI + 0x10));
    if (pvVar1 <= pvVar2) break;
    v_array<recall_tree_ns::node>::operator[]
              ((v_array<recall_tree_ns::node> *)(in_RDI + 0x10),(size_t)this);
    v_array<recall_tree_ns::node_pred>::delete_v((v_array<recall_tree_ns::node_pred> *)this);
    pvVar2 = (v_array<recall_tree_ns::node> *)((long)&this->_begin + 1);
  }
  v_array<recall_tree_ns::node>::delete_v(this);
  return;
}

Assistant:

void finish(recall_tree& b)
{
  for (size_t i = 0; i < b.nodes.size(); ++i) b.nodes[i].preds.delete_v();
  b.nodes.delete_v();
}